

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseForString(ParseParameters *Params,size_t *pErrorAtPos)

{
  size_t local_40;
  size_t actualStringLen;
  size_t maxStringLen;
  char *stringStart;
  char *processedString;
  size_t *psStack_18;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  ParseParameters *Params_local;
  
  stringStart = (char *)0x0;
  maxStringLen = (size_t)(Params->JsonString + Params->StringIndex);
  actualStringLen = Params->JsonStringLength - Params->StringIndex;
  local_40 = 0;
  processedString._4_4_ = JL_STATUS_NOT_FOUND;
  if ((3 < actualStringLen) && (*(int *)maxStringLen == 0x6c6c756e)) {
    Params->Stack[Params->StackIndex].FinishedProcessing = true;
    Params->StringIndex = Params->StringIndex + 4;
    processedString._4_4_ = JL_STATUS_SUCCESS;
  }
  psStack_18 = pErrorAtPos;
  pErrorAtPos_local = (size_t *)Params;
  if (processedString._4_4_ == JL_STATUS_NOT_FOUND) {
    processedString._4_4_ =
         ParseString((char *)maxStringLen,actualStringLen,false,(_Bool)(Params->IsJson5 & 1),
                     &local_40,&stringStart);
    if (processedString._4_4_ == JL_STATUS_SUCCESS) {
      pErrorAtPos_local[4] = local_40 + pErrorAtPos_local[4];
      *(undefined1 *)(*pErrorAtPos_local + (long)(int)pErrorAtPos_local[1] * 0x28 + 0x10) = 1;
      processedString._4_4_ =
           JlSetObjectString(*(JlDataObject **)
                              (*pErrorAtPos_local + (long)(int)pErrorAtPos_local[1] * 0x28 + 8),
                             stringStart);
      WjTestLib_Free(stringStart);
    }
    else if ((local_40 != 0) && (psStack_18 != (size_t *)0x0)) {
      *psStack_18 = pErrorAtPos_local[4] + local_40;
    }
  }
  if (processedString._4_4_ != JL_STATUS_SUCCESS) {
    JlFreeObjectTree((JlDataObject **)
                     (*pErrorAtPos_local + (long)(int)pErrorAtPos_local[1] * 0x28 + 8));
  }
  return processedString._4_4_;
}

Assistant:

static
JL_STATUS
    ParseForString
    (
        ParseParameters*    Params,
        size_t*             pErrorAtPos
    )
{
    JL_STATUS jlStatus;
    char* processedString = NULL;
    char const* stringStart = Params->JsonString + Params->StringIndex;
    size_t maxStringLen = Params->JsonStringLength - Params->StringIndex;
    size_t actualStringLen = 0;

    // Check if this is a json null
    jlStatus = JL_STATUS_NOT_FOUND;
    if( maxStringLen >= 4 )
    {
        if( memcmp( stringStart, "null", 4 ) == 0 )
        {
            // We already have a string object created, so just leave it and it will be left as NULL.
            Params->Stack[Params->StackIndex].FinishedProcessing = true;
            Params->StringIndex += 4;
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    if( JL_STATUS_NOT_FOUND == jlStatus )
    {
        // Now treat as a normal string
        jlStatus = ParseString( stringStart, maxStringLen, false, Params->IsJson5, &actualStringLen, &processedString );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            Params->StringIndex += actualStringLen;

            // Set string in object (was already setup as a string object)
            Params->Stack[Params->StackIndex].FinishedProcessing = true;
            jlStatus = JlSetObjectString( Params->Stack[Params->StackIndex].Object, processedString );

            JlFree( processedString );
        }
        else
        {
            if( actualStringLen > 0 )
            {
                // If an error occured in the middle of the string, this will be set to where the error happened.
                if( NULL != pErrorAtPos )
                {
                    *pErrorAtPos = Params->StringIndex + actualStringLen;
                }
            }
        }
    }

    if( JL_STATUS_SUCCESS != jlStatus )
    {
        (void) JlFreeObjectTree( &Params->Stack[Params->StackIndex].Object );
    }

    return jlStatus;
}